

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>_>
::expand(Stack<std::unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>_>
         *this)

{
  DArray<Kernel::TermList> *pDVar1;
  DArray<Kernel::TermList> *this_00;
  unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  *in_RDI;
  size_t i;
  unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  *newStack;
  void *mem;
  size_t newCapacity;
  DArray<Kernel::TermList> *pDVar2;
  DArray<Kernel::TermList> *local_28;
  
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl ==
      (DArray<Kernel::TermList> *)0x0) {
    pDVar1 = (DArray<Kernel::TermList> *)0x8;
  }
  else {
    pDVar1 = (DArray<Kernel::TermList> *)
             ((long)(in_RDI->_M_t).
                    super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                    .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl << 1
             );
  }
  pDVar2 = pDVar1;
  this_00 = (DArray<Kernel::TermList> *)Lib::alloc((size_t)in_RDI);
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl !=
      (DArray<Kernel::TermList> *)0x0) {
    for (local_28 = (DArray<Kernel::TermList> *)0x0;
        local_28 <
        (in_RDI->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl;
        local_28 = (DArray<Kernel::TermList> *)((long)&local_28->_size + 1)) {
      std::
      unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      ::unique_ptr(in_RDI,(unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                           *)pDVar2);
      std::
      unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      ::~unique_ptr((unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                     *)this_00);
    }
    Lib::free(in_RDI[1]._M_t.
              super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl);
  }
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl = this_00;
  in_RDI[2]._M_t.
  super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
       (DArray<Kernel::TermList> *)
       (&(in_RDI[1]._M_t.
          super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
          .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl)->_size +
       (long)(in_RDI->_M_t).
             super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
             .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl);
  in_RDI[3]._M_t.
  super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
       (DArray<Kernel::TermList> *)
       (&(in_RDI[1]._M_t.
          super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
          .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl)->_size +
       (long)pDVar1);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl = pDVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }